

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O0

void __thiscall
xLearn::FFMScore::CalcGrad(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  int iVar1;
  ostream *poVar2;
  long in_RDI;
  LogSeverity in_XMM0_Da;
  real_t in_stack_000000c0;
  real_t in_stack_000000c4;
  Model *in_stack_000000c8;
  SparseRow *in_stack_000000d0;
  FFMScore *in_stack_000000d8;
  real_t in_stack_00000100;
  real_t in_stack_00000104;
  Model *in_stack_00000108;
  SparseRow *in_stack_00000110;
  FFMScore *in_stack_00000118;
  real_t in_stack_000001b0;
  real_t in_stack_000001b4;
  Model *in_stack_000001b8;
  SparseRow *in_stack_000001c0;
  FFMScore *in_stack_000001c8;
  allocator *this_00;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [16];
  string *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  
  iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
  if (iVar1 == 0) {
    calc_grad_sgd(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,
                  in_stack_000000c0);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
    if (iVar1 == 0) {
      calc_grad_adagrad(in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000104,
                        in_stack_00000100);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
      if (iVar1 == 0) {
        calc_grad_ftrl(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,
                       in_stack_000001b0);
      }
      else {
        Logger::Logger((Logger *)&stack0xffffffffffffffdc,FATAL);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/score/ffm_score.cc"
                   ,&local_49);
        this_00 = &local_81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"CalcGrad",this_00);
        poVar2 = Logger::Start(in_XMM0_Da,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                               in_stack_ffffffffffffffc8);
        poVar2 = std::operator<<(poVar2,"Unknow optimization method: ");
        std::operator<<(poVar2,(string *)(in_RDI + 0x20));
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        Logger::~Logger((Logger *)this_00);
      }
    }
  }
  return;
}

Assistant:

void FFMScore::CalcGrad(const SparseRow* row,
                        Model& model,
                        real_t pg,
                        real_t norm) {
  // Using sgd
  if (opt_type_.compare("sgd") == 0) {
    this->calc_grad_sgd(row, model, pg, norm);
  }
  // Using adagrad
  else if (opt_type_.compare("adagrad") == 0) {
    this->calc_grad_adagrad(row, model, pg, norm);
  }
  // Using ftrl 
  else if (opt_type_.compare("ftrl") == 0) {
    this->calc_grad_ftrl(row, model, pg, norm);
  } 
  else {
    LOG(FATAL) << "Unknow optimization method: " << opt_type_;
  }
}